

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_gzip_filter_module.c
# Opt level: O1

ngx_int_t ngx_http_gzip_ratio_variable
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  void *pvVar1;
  u_char *puVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = *(uint *)v;
  *(uint *)v = (uVar5 & 0x8fffffff) + 0x10000000;
  pvVar1 = r->ctx[ngx_http_gzip_filter_module.ctx_index];
  if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0x80) == 0)) {
    uVar5 = uVar5 & 0x8fffffff | 0x50000000;
  }
  else {
    puVar2 = (u_char *)ngx_pnalloc(r->pool,0xe);
    v->data = puVar2;
    if (puVar2 == (u_char *)0x0) {
      return -1;
    }
    uVar7 = *(ulong *)((long)pvVar1 + 0x78);
    uVar4 = *(ulong *)((long)pvVar1 + 0x80);
    uVar3 = uVar7 / uVar4;
    uVar6 = ((uVar7 * 100) / uVar4) % 100;
    uVar4 = (uVar7 * 1000) / uVar4;
    uVar7 = uVar6;
    if (4 < uVar4 + (uVar4 / 5 & 0xfffffffffffffffe) * -5) {
      uVar3 = (uVar3 + 1) - (ulong)(uVar6 < 99);
      uVar7 = 0;
      if (uVar6 < 99) {
        uVar7 = uVar6 + 1;
      }
    }
    puVar2 = ngx_sprintf(puVar2,"%ui.%02ui",uVar3,uVar7);
    uVar5 = *(uint *)v & 0xf0000000 | (int)puVar2 - *(int *)&v->data & 0xfffffffU;
  }
  *(uint *)v = uVar5;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_gzip_ratio_variable(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    ngx_uint_t            zint, zfrac;
    ngx_http_gzip_ctx_t  *ctx;

    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;

    ctx = ngx_http_get_module_ctx(r, ngx_http_gzip_filter_module);

    if (ctx == NULL || ctx->zout == 0) {
        v->not_found = 1;
        return NGX_OK;
    }

    v->data = ngx_pnalloc(r->pool, NGX_INT32_LEN + 3);
    if (v->data == NULL) {
        return NGX_ERROR;
    }

    zint = (ngx_uint_t) (ctx->zin / ctx->zout);
    zfrac = (ngx_uint_t) ((ctx->zin * 100 / ctx->zout) % 100);

    if ((ctx->zin * 1000 / ctx->zout) % 10 > 4) {

        /* the rounding, e.g., 2.125 to 2.13 */

        zfrac++;

        if (zfrac > 99) {
            zint++;
            zfrac = 0;
        }
    }

    v->len = ngx_sprintf(v->data, "%ui.%02ui", zint, zfrac) - v->data;

    return NGX_OK;
}